

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::
ReadColumnSizes<true>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
           *this)

{
  CStringRef arg0;
  CStringRef arg0_00;
  int iVar1;
  int iVar2;
  undefined8 *in_RDI;
  int size;
  int i;
  int prev_size;
  ColumnSizeHandler size_handler;
  int num_sizes;
  undefined8 in_stack_ffffffffffffffb8;
  ColumnSizeHandler *in_stack_ffffffffffffffc0;
  BasicCStringRef<char> local_30;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  BasicCStringRef<char> in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar2 = *(int *)in_RDI[1] + -1;
  iVar1 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x249028);
  if (iVar1 != iVar2) {
    in_stack_ffffffffffffffc0 = (ColumnSizeHandler *)*in_RDI;
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"expected {}");
    arg0.data_._4_4_ = iVar2;
    arg0.data_._0_4_ = in_stack_fffffffffffffff0;
    TextReader<fmt::Locale>::ReportError<int>
              ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe8.data_,arg0,
               (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  NLHandler<mp::NullNLHandler<int>,_int>::OnColumnSizes
            ((NLHandler<mp::NullNLHandler<int>,_int> *)0x24907b);
  iVar1 = 0;
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    local_28 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x2490a6);
    if (local_28 < iVar1) {
      in_stack_ffffffffffffffb8 = *in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_30,"invalid column offset");
      arg0_00.data_._4_4_ = iVar2;
      arg0_00.data_._0_4_ = in_stack_fffffffffffffff0;
      TextReader<fmt::Locale>::ReportError<>
                ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe8.data_,arg0_00);
    }
    local_28 = local_28 - iVar1;
    iVar1 = local_28 + iVar1;
    NLHandler<mp::NullNLHandler<int>,_int>::ColumnSizeHandler::Add
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)CONCAT44(in_stack_ffffffffffffffe4,iVar1));
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}